

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_utils.c
# Opt level: O0

stack_char_ptr_t * stack_ptr_parse(stack_char_ptr_t *stack,char *data,char *delim)

{
  char *local_30;
  char *param;
  char *brkt;
  char *delim_local;
  char *data_local;
  stack_char_ptr_t *stack_local;
  
  brkt = delim;
  delim_local = data;
  data_local = (char *)stack;
  if (stack == (stack_char_ptr_t *)0x0) {
    data_local = (char *)stack_ptr_alloc(data);
  }
  param = (char *)0x0;
  local_30 = strtok_r(*(char **)data_local,brkt,&param);
  while (local_30 != (char *)0x0) {
    data_local = (char *)stack_ptr_push((stack_char_ptr_t *)data_local,local_30);
    local_30 = strtok_r((char *)0x0,brkt,&param);
  }
  return (stack_char_ptr_t *)data_local;
}

Assistant:

stack_char_ptr_t *stack_ptr_parse(stack_char_ptr_t *stack, const char *data, const char *delim) {
    if (NULL == stack) {
        stack = stack_ptr_alloc(data);
    }

    char *brkt = NULL;
    for (char *param = strtok_r(stack->data, delim, &brkt);
         param;
         param = strtok_r(NULL, delim, &brkt)) {
        stack = stack_ptr_push(stack, param);
    }

    return stack;
}